

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

_Bool array_container_remove(array_container_t *arr,uint16_t pos)

{
  uint uVar1;
  
  uVar1 = binarySearch(arr->array,arr->cardinality,pos);
  if (-1 < (int)uVar1) {
    memmove(arr->array + uVar1,arr->array + (ulong)uVar1 + 1,
            (long)(int)(~uVar1 + arr->cardinality) * 2);
    arr->cardinality = arr->cardinality + -1;
  }
  return -1 < (int)uVar1;
}

Assistant:

static inline bool array_container_remove(array_container_t *arr,
                                          uint16_t pos) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, pos);
    const bool is_present = idx >= 0;
    if (is_present) {
        memmove(arr->array + idx, arr->array + idx + 1,
                (arr->cardinality - idx - 1) * sizeof(uint16_t));
        arr->cardinality--;
    }

    return is_present;
}